

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void av1_rc_set_frame_target(AV1_COMP *cpi,int target,int width,int height)

{
  int iVar1;
  long lVar2;
  int in_ECX;
  int in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  double dVar3;
  int64_t sb64_target_rate;
  RATE_CONTROL *rc;
  AV1_COMMON *cm;
  AV1_COMMON *in_stack_ffffffffffffffc0;
  
  *(undefined4 *)(in_RDI + 0x60774) = in_ESI;
  iVar1 = av1_frame_scaled(in_stack_ffffffffffffffc0);
  if ((iVar1 != 0) && (*(int *)(in_RDI + 0x423dc) != 1)) {
    iVar1 = *(int *)(in_RDI + 0x60774);
    dVar3 = resize_rate_factor((FrameDimensionCfg *)(in_RDI + 0x42338),in_EDX,in_ECX);
    iVar1 = saturate_cast_double_to_int((double)iVar1 * dVar3);
    *(int *)(in_RDI + 0x60774) = iVar1;
  }
  lVar2 = ((long)*(int *)(in_RDI + 0x60774) << 0xc) / (long)(in_EDX * in_ECX);
  if (0x7ffffffe < lVar2) {
    lVar2 = 0x7fffffff;
  }
  *(int *)(in_RDI + 0x60780) = (int)lVar2;
  return;
}

Assistant:

void av1_rc_set_frame_target(AV1_COMP *cpi, int target, int width, int height) {
  const AV1_COMMON *const cm = &cpi->common;
  RATE_CONTROL *const rc = &cpi->rc;

  rc->this_frame_target = target;

  // Modify frame size target when down-scaled.
  if (av1_frame_scaled(cm) && cpi->oxcf.rc_cfg.mode != AOM_CBR) {
    rc->this_frame_target = saturate_cast_double_to_int(
        rc->this_frame_target *
        resize_rate_factor(&cpi->oxcf.frm_dim_cfg, width, height));
  }

  // Target rate per SB64 (including partial SB64s.
  const int64_t sb64_target_rate =
      ((int64_t)rc->this_frame_target << 12) / (width * height);
  rc->sb64_target_rate = (int)AOMMIN(sb64_target_rate, INT_MAX);
}